

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O2

void valid_option(int argc,char **argv,char *in_path,char *out_path,float *sigma1,float *sigma2,
                 int *histo,int *sf,float *trsh,char *i_fname,char *v_fname,char *c_fname,
                 char *h_fname,int *nbin,float *incr,int *n_frame,float *alpha,float *delta,
                 int *iter,int *binary,int *row,int *col,int *horn,int *vmag,float *maxv)

{
  byte bVar1;
  byte *__s2;
  uint uVar2;
  int iVar3;
  float *pfVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  string ext;
  string str_delta;
  string str_alpha;
  string str_tg;
  string str_sg;
  string str_trsh;
  string t0;
  
  if (argc == 1) {
    usage();
  }
  else {
    if (0x18 < argc - 4U) {
LAB_00104173:
      iVar5 = 1;
      goto LAB_00104175;
    }
    *binary = 0;
    *horn = 0;
    *vmag = 0;
    *sf = 0;
    *histo = 0;
    *trsh = 0.0;
    *maxv = 0.0;
    *sigma1 = 3.0;
    builtin_strncpy(str_sg,"3.0",4);
    *sigma2 = 1.5;
    builtin_strncpy(str_tg,"1.5",4);
    *iter = 10;
    *alpha = 5.0;
    builtin_strncpy(str_alpha,"5.0",4);
    *delta = 1.0;
    builtin_strncpy(str_delta,"1.0",4);
    *n_frame = 0;
    *nbin = 0;
    builtin_strncpy(i_fname,"Undefined",10);
    builtin_strncpy(v_fname,"Undefined",10);
    builtin_strncpy(c_fname,"Undefined",10);
    builtin_strncpy(h_fname,"Undefined",10);
    uVar6 = 4;
    while (iVar5 = (int)uVar6, iVar5 < argc) {
      __s2 = (byte *)argv[uVar6];
      bVar1 = *__s2;
      iVar9 = -(bVar1 - 0x2d);
      iVar3 = iVar9;
      if (bVar1 == 0x2d) {
        uVar2 = __s2[1] - 0x41;
        if (uVar2 == 0) {
          uVar2 = (uint)__s2[2];
        }
        if (uVar2 != 0) {
          uVar2 = __s2[1] - 0x46;
          if (uVar2 == 0) {
            uVar2 = (uint)__s2[2];
          }
          iVar3 = -uVar2;
          goto LAB_00103a57;
        }
        uVar2 = iVar5 + 1;
        if ((int)uVar2 < argc) {
          __isoc99_sscanf(argv[uVar2],"%f",alpha);
          pcVar7 = argv[uVar2];
          pcVar8 = str_alpha;
          goto LAB_00103e56;
        }
        goto LAB_00104173;
      }
LAB_00103a57:
      if (iVar3 == 0) {
        uVar2 = iVar5 + 1;
        if (argc <= (int)uVar2) goto LAB_00104173;
        __isoc99_sscanf(argv[uVar2],"%f",trsh);
        strcpy(str_trsh,argv[uVar2]);
        *sf = 1;
LAB_00103e5b:
        iVar3 = 2;
      }
      else {
        iVar3 = iVar9;
        if (bVar1 == 0x2d) {
          uVar2 = __s2[1] - 0x43;
          if (uVar2 == 0) {
            uVar2 = (uint)__s2[2];
          }
          if (uVar2 != 0) {
            uVar2 = __s2[1] - 0x49;
            if (uVar2 == 0) {
              uVar2 = (uint)__s2[2];
            }
            iVar3 = -uVar2;
            goto LAB_00103a9f;
          }
          if ((int)(iVar5 + 3U) < argc) {
            strcpy(c_fname,argv[uVar6 + 1]);
            __isoc99_sscanf(argv[uVar6 + 2],"%d",nbin);
            __isoc99_sscanf(argv[iVar5 + 3U],"%f",incr);
            *histo = 1;
            iVar3 = 4;
            goto LAB_00103e5e;
          }
          goto LAB_00104173;
        }
LAB_00103a9f:
        if (iVar3 == 0) {
          if ((int)(iVar5 + 1U) < argc) {
            pcVar8 = argv[iVar5 + 1U];
            pcVar7 = "%d";
            pfVar4 = (float *)iter;
LAB_00103c89:
            __isoc99_sscanf(pcVar8,pcVar7,pfVar4);
            goto LAB_00103e5b;
          }
          goto LAB_00104173;
        }
        iVar3 = strcmp("-SG",(char *)__s2);
        if (iVar3 == 0) {
          uVar2 = iVar5 + 1;
          if ((int)uVar2 < argc) {
            __isoc99_sscanf(argv[uVar2],"%f",sigma1);
            pcVar7 = argv[uVar2];
            pcVar8 = str_sg;
LAB_00103e56:
            strcpy(pcVar8,pcVar7);
            goto LAB_00103e5b;
          }
          goto LAB_00104173;
        }
        iVar3 = strcmp("-TG",(char *)__s2);
        if (iVar3 == 0) {
          uVar2 = iVar5 + 1;
          if ((int)uVar2 < argc) {
            __isoc99_sscanf(argv[uVar2],"%f",sigma2);
            pcVar7 = argv[uVar2];
            pcVar8 = str_tg;
            goto LAB_00103e56;
          }
          goto LAB_00104173;
        }
        iVar3 = iVar9;
        if (bVar1 == 0x2d) {
          uVar2 = __s2[1] - 0x4d;
          if (uVar2 == 0) {
            uVar2 = (uint)__s2[2];
          }
          if (uVar2 == 0) {
            if ((int)(iVar5 + 1U) < argc) {
              pcVar8 = argv[iVar5 + 1U];
              pcVar7 = "%d";
              pfVar4 = (float *)n_frame;
              goto LAB_00103c89;
            }
            goto LAB_00104173;
          }
          uVar2 = __s2[1] - 0x42;
          if (uVar2 == 0) {
            uVar2 = (uint)__s2[2];
          }
          iVar3 = -uVar2;
        }
        if (iVar3 != 0) {
          iVar3 = iVar9;
          if (bVar1 == 0x2d) {
            uVar2 = __s2[1] - 0x48;
            if (uVar2 == 0) {
              uVar2 = (uint)__s2[2];
            }
            if (uVar2 == 0) {
              *horn = 1;
              iVar3 = 1;
              goto LAB_00103e5e;
            }
            uVar2 = __s2[1] - 0x44;
            if (uVar2 == 0) {
              uVar2 = (uint)__s2[2];
            }
            iVar3 = -uVar2;
          }
          if (iVar3 == 0) {
            uVar2 = iVar5 + 1;
            if ((int)uVar2 < argc) {
              __isoc99_sscanf(argv[uVar2],"%f",delta);
              pcVar7 = argv[uVar2];
              pcVar8 = str_delta;
              goto LAB_00103e56;
            }
            goto LAB_00104173;
          }
          if (bVar1 == 0x2d) {
            uVar2 = __s2[1] - 0x56;
            if (uVar2 == 0) {
              uVar2 = (uint)__s2[2];
            }
            iVar9 = -uVar2;
          }
          if (iVar9 == 0) {
            if ((int)(iVar5 + 1U) < argc) {
              *vmag = 1;
              pcVar8 = argv[iVar5 + 1U];
              pcVar7 = "%f";
              pfVar4 = maxv;
              goto LAB_00103c89;
            }
            goto LAB_00104173;
          }
          iVar5 = 2;
          goto LAB_00104175;
        }
        if (argc <= (int)(iVar5 + 2U)) goto LAB_00104173;
        __isoc99_sscanf(argv[uVar6 + 1],"%d",col);
        __isoc99_sscanf(argv[iVar5 + 2U],"%d",row);
        *binary = 1;
        iVar3 = 3;
      }
LAB_00103e5e:
      uVar6 = (ulong)(uint)(iVar5 + iVar3);
    }
    if (*nbin < 0x65) {
      concat(argv[1],"/",in_path);
      concat(argv[2],"/",out_path);
      concat(in_path,argv[3],i_fname);
      builtin_strncpy(ext,"-sg",4);
      concat(ext,str_sg,ext);
      concat(ext,"-tg",ext);
      concat(ext,str_tg,ext);
      concat(ext,"-m",ext);
      sprintf(t0,"%d",(ulong)(uint)*n_frame);
      concat(ext,t0,ext);
      concat(ext,"-i",ext);
      sprintf(t0,"%d",(ulong)(uint)*iter);
      concat(ext,t0,ext);
      concat(ext,"-a",ext);
      concat(ext,str_alpha,ext);
      if (*horn == 0) {
        concat(ext,"-d",ext);
        pcVar8 = str_delta;
      }
      else {
        pcVar8 = "-h";
      }
      concat(ext,pcVar8,ext);
      if (*sf != 0) {
        concat(ext,"-f",ext);
        concat(ext,str_trsh,ext);
      }
      concat(out_path,*argv,v_fname);
      concat(v_fname,".",v_fname);
      concat(v_fname,argv[3],v_fname);
      concat(v_fname,"F",v_fname);
      concat(v_fname,ext,v_fname);
      if (*histo != 0) {
        concat(out_path,*argv,h_fname);
        concat(h_fname,".",h_fname);
        concat(h_fname,argv[3],h_fname);
        concat(h_fname,"H",h_fname);
        concat(h_fname,ext,h_fname);
      }
      printf(" Generated velocity filename  : %s\n",v_fname);
      printf(" Generated histogram filename : %s\n",h_fname);
      printf(" Input stem name              : %s\n",i_fname);
      printf(" Correct velocity filename    : %s\n",c_fname);
      fflush(_stdout);
      return;
    }
  }
  iVar5 = 0xf;
LAB_00104175:
  error(iVar5);
}

Assistant:

void valid_option(argc,argv,in_path,out_path,sigma1,sigma2,histo,sf,trsh,
             i_fname,v_fname,c_fname,h_fname,nbin,incr,n_frame,alpha,
             delta,iter,binary,row,col,horn,vmag,maxv)
int argc ;
char *argv[] ;
int *nbin, *iter, *n_frame, *histo, *sf, *binary, *row, *col, *horn, *vmag ;
float *incr, *sigma1, *sigma2, *trsh, *alpha, *delta, *maxv ;
string in_path, out_path, i_fname, v_fname, c_fname, h_fname ;

{ int i ;
  string ext, t0, str_sg, str_tg, str_trsh, str_alpha, str_delta ;

  if (argc == 1) {
    usage() ;
  }
  if ((argc <= 28) && (argc >= 4)) {
    *binary = FALSE ;
    *horn = FALSE ;
    *vmag = FALSE ;
    *sf = FALSE ;
    *histo = FALSE ;
    *trsh = 0.0 ;
    *maxv = 0.0 ;
    *sigma1 = DEF_S1 ;
    strcpy(str_sg,"3.0") ;
    *sigma2 = DEF_S2 ;
    strcpy(str_tg,"1.5") ;
    *iter = RELAXITER ;
    *alpha = ALPHA ;
    strcpy(str_alpha,"5.0") ;
    *delta = DELTA ;
    strcpy(str_delta,"1.0") ;
    *n_frame = 0 ;
    *nbin = 0 ;
    strcpy(i_fname,"Undefined") ;
    strcpy(v_fname,"Undefined") ;
    strcpy(c_fname,"Undefined") ;
    strcpy(h_fname,"Undefined") ;
  }
  else {
    error(1) ;
  }
  i = 4 ;
  while (i < argc) {
    if (strcmp("-A",argv[i]) == 0) {
      if (i + 1 < argc) {
        sscanf(argv[i+1],"%f",alpha) ;
        strcpy(str_alpha,argv[i+1]) ;
        i += 2 ;
      }
      else {
        error(1) ;
      }
    }
    else {
      if (strcmp("-F",argv[i]) == 0) {
        if (i + 1 < argc) {
          sscanf(argv[i+1],"%f",trsh) ;
          strcpy(str_trsh,argv[i+1]) ;
          *sf = TRUE ;
          i += 2 ;
        }
        else {
          error(1) ;
        }
      }
      else {
        if (strcmp("-C",argv[i]) == 0) {
          if (i + 3 < argc) {
            strcpy(c_fname,argv[i+1]) ;
            sscanf(argv[i+2],"%d",nbin) ;
            sscanf(argv[i+3],"%f",incr) ;
            *histo = TRUE ;
            i += 4 ;
          }
          else {
            error(1) ;
          }
        }
        else {
          if (strcmp("-I",argv[i]) == 0) {
            if (i + 1 < argc) {
              sscanf(argv[i+1],"%d",iter) ;
              i += 2 ;
            }
            else {
              error(1) ;
            }
          }
          else {
            if (strcmp("-SG", argv[i]) == 0) {
              if (i + 1 < argc) {
                sscanf(argv[i+1],"%f",sigma1) ;
                strcpy(str_sg,argv[i+1]) ;
                i += 2 ;
              }
              else {
                error(1) ;
              }
            }
            else {
              if (strcmp("-TG",argv[i]) == 0) {
                if (i + 1 < argc) {
                  sscanf(argv[i+1],"%f",sigma2) ;
                  strcpy(str_tg,argv[i+1]) ;
                  i += 2 ;
                }
                else {
                  error(1) ;
                }
              }
              else {
                if (strcmp("-M",argv[i]) == 0) {
                  if (i + 1 < argc) {
                    sscanf(argv[i+1],"%d",n_frame) ;
                    i += 2 ;
                  }
                  else {
                    error(1) ;
                  }
                }
                else {
                  if (strcmp("-B",argv[i]) == 0) {
                    if (i + 2 < argc) {
                      sscanf(argv[i+1],"%d",col) ;
                      sscanf(argv[i+2],"%d",row) ;
                      *binary = TRUE ;
                      i += 3 ;
                    }
                    else {
                      error(1) ;
                    }
                  }
                  else {
                    if (strcmp("-H",argv[i]) == 0) {
                      *horn = TRUE ;
                      i++ ;
                    }
                    else {
                      if (strcmp("-D",argv[i]) == 0) {
                        if (i + 1 < argc) {
                          sscanf(argv[i+1],"%f",delta) ;
                          strcpy(str_delta,argv[i+1]) ;
                          i += 2 ;
                        }
                        else {
                          error(1) ;
                        }
                      }
                      else {
                        if (strcmp("-V",argv[i]) == 0) {
                          if (i + 1 < argc) {
                            *vmag = TRUE ;
                            sscanf(argv[i+1],"%f",maxv) ;
                            i += 2 ;
                          }
                          else {
                            error(1) ;
                          }
                        }
                        else {
                          error(2) ;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (*nbin > N_BINS) {
    error(15) ;
  }
  concat(argv[1],"/",in_path) ;
  concat(argv[2],"/",out_path) ;
  concat(in_path,argv[3],i_fname) ;
  strcpy(ext,"-sg") ;
  concat(ext,str_sg,ext) ;
  concat(ext,"-tg",ext) ;
  concat(ext,str_tg,ext) ;
  concat(ext,"-m",ext) ;
  sprintf(t0,"%d",*n_frame);
  concat(ext,t0,ext) ;
  concat(ext,"-i",ext) ;
  sprintf(t0,"%d",*iter);
  concat(ext,t0,ext) ;
  concat(ext,"-a",ext) ;
  concat(ext,str_alpha,ext) ;
  if (!(*horn)) {
    concat(ext,"-d",ext) ;
    concat(ext,str_delta,ext) ;
  }
  if (*horn) {
    concat(ext,"-h",ext) ;
  }
  if (*sf) {
    concat(ext,"-f",ext) ;
    concat(ext,str_trsh,ext) ;
  }
  concat(out_path,argv[0],v_fname) ;
  concat(v_fname,".",v_fname) ;
  concat(v_fname,argv[3],v_fname) ;
  concat(v_fname,"F",v_fname) ;
  concat(v_fname,ext,v_fname) ;
  if (*histo) {
    concat(out_path,argv[0],h_fname) ;
    concat(h_fname,".",h_fname) ;
    concat(h_fname,argv[3],h_fname) ;
    concat(h_fname,"H",h_fname) ;
    concat(h_fname,ext,h_fname) ;
  }
  printf(" Generated velocity filename  : %s\n",v_fname) ;
  printf(" Generated histogram filename : %s\n",h_fname) ;
  printf(" Input stem name              : %s\n",i_fname) ;
  printf(" Correct velocity filename    : %s\n",c_fname) ;
  fflush(stdout) ;
}